

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall
HdlcSimulationDataGenerator::GenerateAbortFramesIndexes(HdlcSimulationDataGenerator *this)

{
  int iVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  uint local_1c;
  
  this_00 = &this->mAbortFramesIndexes;
  iVar1 = rand();
  local_1c = iVar1 % 0x32;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (this_00,&local_1c);
  iVar1 = rand();
  local_1c = iVar1 % 0x32;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (this_00,&local_1c);
  iVar1 = rand();
  local_1c = iVar1 % 0x32;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (this_00,&local_1c);
  iVar1 = rand();
  local_1c = iVar1 % 0x32;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (this_00,&local_1c);
  iVar1 = rand();
  local_1c = iVar1 % 0x32;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (this_00,&local_1c);
  iVar1 = rand();
  local_1c = iVar1 % 0x32;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (this_00,&local_1c);
  return;
}

Assistant:

void HdlcSimulationDataGenerator::GenerateAbortFramesIndexes()
{
    mAbortFramesIndexes.push_back( rand() % 50 );
    mAbortFramesIndexes.push_back( rand() % 50 );
    mAbortFramesIndexes.push_back( rand() % 50 );
    mAbortFramesIndexes.push_back( rand() % 50 );
    mAbortFramesIndexes.push_back( rand() % 50 );
    mAbortFramesIndexes.push_back( rand() % 50 );
}